

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallTargetGenerator::AddChrpathPatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  bool bVar2;
  __type _Var3;
  cmComputeLinkInformation *this_01;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  cmGlobalGenerator *pcVar7;
  iterator iVar8;
  pointer pbVar9;
  int darwin_major_version;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newRuntimeDirs;
  string runpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldRuntimeDirs;
  string darwin_major_version_s;
  string installNameTool;
  istringstream ss;
  byte abStack_308 [352];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runpaths;
  
  if (this->ImportLibrary == false) {
    bVar2 = cmGeneratorTarget::IsChrpathUsed(this->Target,config);
    if (bVar2) {
      this_01 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        this_00 = this->Target->Target->Makefile;
        std::__cxx11::string::string
                  ((string *)&ss,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator *)&runpaths);
        bVar2 = cmMakefile::IsOn(this_00,(string *)&ss);
        std::__cxx11::string::~string((string *)&ss);
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)&ss,"CMAKE_INSTALL_NAME_TOOL",(allocator *)&runpaths);
          pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&ss);
          std::__cxx11::string::string
                    ((string *)&installNameTool,pcVar4,(allocator *)&darwin_major_version_s);
          std::__cxx11::string::~string((string *)&ss);
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          oldRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          newRuntimeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmComputeLinkInformation::GetRPath(this_01,&oldRuntimeDirs,false);
          cmComputeLinkInformation::GetRPath(this_01,&newRuntimeDirs,true);
          std::__cxx11::string::string((string *)&ss,"DARWIN_MAJOR_VERSION",(allocator *)&runpaths);
          pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&ss);
          std::__cxx11::string::string
                    ((string *)&darwin_major_version_s,pcVar4,(allocator *)&runpath);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&ss,(string *)&darwin_major_version_s,_S_in);
          std::istream::operator>>((istream *)&ss,&darwin_major_version);
          if ((((abStack_308[*(long *)(_ss + -0x18)] & 5) == 0) && (darwin_major_version < 10)) &&
             ((oldRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               oldRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ||
              (newRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               newRuntimeDirs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&runpaths);
            poVar5 = std::operator<<((ostream *)&runpaths,"WARNING: Target \"");
            psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
            poVar5 = std::operator<<(poVar5,(string *)psVar6);
            poVar5 = std::operator<<(poVar5,
                                     "\" has runtime paths which cannot be changed during install.  "
                                    );
            poVar5 = std::operator<<(poVar5,
                                     "To change runtime paths, OS X version 10.6 or newer is required.  "
                                    );
            poVar5 = std::operator<<(poVar5,
                                     "Therefore, runtime paths will not be changed when installing.  "
                                    );
            std::operator<<(poVar5,
                            "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around this limitation."
                           );
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this_00,WARNING,&runpath);
            std::__cxx11::string::~string((string *)&runpath);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&runpaths);
          }
          else {
            p_Var1 = &runpaths._M_t._M_impl.super__Rb_tree_header;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pbVar9 = oldRuntimeDirs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
            runpaths._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
            for (; pbVar9 != oldRuntimeDirs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
              pcVar7 = cmMakefile::GetGlobalGenerator(this_00);
              (*pcVar7->_vptr_cmGlobalGenerator[0x10])(&runpath,pcVar7,pbVar9,config);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&runpaths._M_t,&runpath);
              if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&runpaths,&runpath);
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"execute_process(COMMAND ");
                poVar5 = std::operator<<(poVar5,(string *)&installNameTool);
                std::operator<<(poVar5,"\n");
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"  -delete_rpath \"");
                poVar5 = std::operator<<(poVar5,(string *)&runpath);
                std::operator<<(poVar5,"\"\n");
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"  \"");
                poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
                std::operator<<(poVar5,"\")\n");
              }
              std::__cxx11::string::~string((string *)&runpath);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&runpaths._M_t);
            for (pbVar9 = newRuntimeDirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pbVar9 != newRuntimeDirs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
              pcVar7 = cmMakefile::GetGlobalGenerator(this_00);
              (*pcVar7->_vptr_cmGlobalGenerator[0x10])(&runpath,pcVar7,pbVar9,config);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&runpaths._M_t,&runpath);
              if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"execute_process(COMMAND ");
                poVar5 = std::operator<<(poVar5,(string *)&installNameTool);
                std::operator<<(poVar5,"\n");
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"  -add_rpath \"");
                poVar5 = std::operator<<(poVar5,(string *)&runpath);
                std::operator<<(poVar5,"\"\n");
                poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
                poVar5 = std::operator<<(poVar5,"  \"");
                poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
                std::operator<<(poVar5,"\")\n");
              }
              std::__cxx11::string::~string((string *)&runpath);
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&runpaths._M_t);
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          std::__cxx11::string::~string((string *)&darwin_major_version_s);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&newRuntimeDirs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&oldRuntimeDirs);
          psVar6 = &installNameTool;
        }
        else {
          cmComputeLinkInformation::GetRPathString_abi_cxx11_((string *)&ss,this_01,false);
          cmComputeLinkInformation::GetChrpathString_abi_cxx11_((string *)&runpaths,this_01);
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&ss,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&runpaths);
          if (!_Var3) {
            poVar5 = operator<<(os,(cmScriptGeneratorIndent)indent.Level);
            poVar5 = std::operator<<(poVar5,"file(RPATH_CHANGE\n");
            poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
            poVar5 = std::operator<<(poVar5,"     FILE \"");
            poVar5 = std::operator<<(poVar5,(string *)toDestDirPath);
            poVar5 = std::operator<<(poVar5,"\"\n");
            poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
            poVar5 = std::operator<<(poVar5,"     OLD_RPATH \"");
            poVar5 = std::operator<<(poVar5,(string *)&ss);
            poVar5 = std::operator<<(poVar5,"\"\n");
            poVar5 = operator<<(poVar5,(cmScriptGeneratorIndent)indent.Level);
            poVar5 = std::operator<<(poVar5,"     NEW_RPATH \"");
            poVar5 = std::operator<<(poVar5,(string *)&runpaths);
            std::operator<<(poVar5,"\")\n");
          }
          std::__cxx11::string::~string((string *)&runpaths);
          psVar6 = (string *)&ss;
        }
        std::__cxx11::string::~string((string *)psVar6);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddChrpathPatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  // Skip the chrpath if the target does not need it.
  if (this->ImportLibrary || !this->Target->IsChrpathUsed(config)) {
    return;
  }

  // Get the link information for this target.
  // It can provide the RPATH.
  cmComputeLinkInformation* cli = this->Target->GetLinkInformation(config);
  if (!cli) {
    return;
  }

  cmMakefile* mf = this->Target->Target->GetMakefile();

  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // If using install_name_tool, set up the rules to modify the rpaths.
    std::string installNameTool =
      mf->GetSafeDefinition("CMAKE_INSTALL_NAME_TOOL");

    std::vector<std::string> oldRuntimeDirs, newRuntimeDirs;
    cli->GetRPath(oldRuntimeDirs, false);
    cli->GetRPath(newRuntimeDirs, true);

    std::string darwin_major_version_s =
      mf->GetSafeDefinition("DARWIN_MAJOR_VERSION");

    std::istringstream ss(darwin_major_version_s);
    int darwin_major_version;
    ss >> darwin_major_version;
    if (!ss.fail() && darwin_major_version <= 9 &&
        (!oldRuntimeDirs.empty() || !newRuntimeDirs.empty())) {
      std::ostringstream msg;
      msg
        << "WARNING: Target \"" << this->Target->GetName()
        << "\" has runtime paths which cannot be changed during install.  "
        << "To change runtime paths, OS X version 10.6 or newer is required.  "
        << "Therefore, runtime paths will not be changed when installing.  "
        << "CMAKE_BUILD_WITH_INSTALL_RPATH may be used to work around"
           " this limitation.";
      mf->IssueMessage(cmake::WARNING, msg.str());
    } else {
      // Note: These paths are kept unique to avoid
      // install_name_tool corruption.
      std::set<std::string> runpaths;
      for (std::vector<std::string>::const_iterator i = oldRuntimeDirs.begin();
           i != oldRuntimeDirs.end(); ++i) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(*i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          runpaths.insert(runpath);
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -delete_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }

      runpaths.clear();
      for (std::vector<std::string>::const_iterator i = newRuntimeDirs.begin();
           i != newRuntimeDirs.end(); ++i) {
        std::string runpath =
          mf->GetGlobalGenerator()->ExpandCFGIntDir(*i, config);

        if (runpaths.find(runpath) == runpaths.end()) {
          os << indent << "execute_process(COMMAND " << installNameTool
             << "\n";
          os << indent << "  -add_rpath \"" << runpath << "\"\n";
          os << indent << "  \"" << toDestDirPath << "\")\n";
        }
      }
    }
  } else {
    // Construct the original rpath string to be replaced.
    std::string oldRpath = cli->GetRPathString(false);

    // Get the install RPATH from the link information.
    std::string newRpath = cli->GetChrpathString();

    // Skip the rule if the paths are identical
    if (oldRpath == newRpath) {
      return;
    }

    // Write a rule to run chrpath to set the install-tree RPATH
    os << indent << "file(RPATH_CHANGE\n"
       << indent << "     FILE \"" << toDestDirPath << "\"\n"
       << indent << "     OLD_RPATH \"" << oldRpath << "\"\n"
       << indent << "     NEW_RPATH \"" << newRpath << "\")\n";
  }
}